

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O0

void __thiscall libtorrent::aux::torrent::start_announcing(torrent *this)

{
  session_interface *psVar1;
  bool bVar2;
  int iVar3;
  pointer this_00;
  undefined4 extraout_var;
  enable_shared_from_this<libtorrent::aux::torrent> local_30;
  weak_ptr<libtorrent::aux::torrent> local_20;
  torrent *local_10;
  torrent *this_local;
  
  local_10 = this;
  bVar2 = is_paused(this);
  if (bVar2) {
    (*(this->super_request_callback)._vptr_request_callback[7])(this,"start_announcing(), paused");
    return;
  }
  if ((((byte)this->field_0x5c0 >> 3 & 1) == 0) && (bVar2 = valid_metadata(this), bVar2)) {
    (*(this->super_request_callback)._vptr_request_callback[7])
              (this,"start_announcing(), files not checked (with valid metadata)");
    return;
  }
  if (((byte)this->field_0x5c0 >> 6 & 1) != 0) {
    return;
  }
  this->field_0x5c0 = this->field_0x5c0 & 0xbf | 0x40;
  bVar2 = ::std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr *)&(this->super_torrent_hot_members).m_peer_list);
  if (bVar2) {
    this_00 = ::std::
              unique_ptr<libtorrent::aux::peer_list,_std::default_delete<libtorrent::aux::peer_list>_>
              ::operator->(&(this->super_torrent_hot_members).m_peer_list);
    iVar3 = peer_list::num_peers(this_00);
    if (0x31 < iVar3) goto LAB_0066abce;
  }
  iVar3 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger
            [0x49])();
  if (CONCAT44(extraout_var,iVar3) != 0) {
    psVar1 = (this->super_torrent_hot_members).m_ses;
    ::std::enable_shared_from_this<libtorrent::aux::torrent>::shared_from_this(&local_30);
    ::std::weak_ptr<libtorrent::aux::torrent>::weak_ptr<libtorrent::aux::torrent,void>
              (&local_20,(shared_ptr<libtorrent::aux::torrent> *)&local_30);
    (*(psVar1->super_session_logger)._vptr_session_logger[0x4a])();
    ::std::weak_ptr<libtorrent::aux::torrent>::~weak_ptr(&local_20);
    ::std::shared_ptr<libtorrent::aux::torrent>::~shared_ptr
              ((shared_ptr<libtorrent::aux::torrent> *)&local_30);
  }
LAB_0066abce:
  tracker_list::reset(&this->m_trackers);
  this->m_total_failed_bytes = 0;
  this->m_total_redundant_bytes = 0;
  stat::clear(&this->m_stat);
  update_want_tick(this);
  announce_with_tracker(this,none);
  lsd_announce(this);
  return;
}

Assistant:

void torrent::start_announcing()
	{
		TORRENT_ASSERT(is_single_thread());
		TORRENT_ASSERT(state() != torrent_status::checking_files);
		if (is_paused())
		{
#ifndef TORRENT_DISABLE_LOGGING
			debug_log("start_announcing(), paused");
#endif
			return;
		}
		// if we don't have metadata, we need to announce
		// before checking files, to get peers to
		// request the metadata from
		if (!m_files_checked && valid_metadata())
		{
#ifndef TORRENT_DISABLE_LOGGING
			debug_log("start_announcing(), files not checked (with valid metadata)");
#endif
			return;
		}
		if (m_announcing) return;

		m_announcing = true;

#ifndef TORRENT_DISABLE_DHT
		if ((!m_peer_list || m_peer_list->num_peers() < 50) && m_ses.dht())
		{
			// we don't have any peers, prioritize
			// announcing this torrent with the DHT
			m_ses.prioritize_dht(shared_from_this());
		}
#endif

		// tell the tracker that we're back
		m_trackers.reset();

		// reset the stats, since from the tracker's
		// point of view, this is a new session
		m_total_failed_bytes = 0;
		m_total_redundant_bytes = 0;
		m_stat.clear();

		update_want_tick();

		announce_with_tracker();

		lsd_announce();
	}